

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O0

ptr_t aeron::util::MemoryMappedFile::mapExisting(char *filename,off_t offset,size_t length)

{
  string *what;
  string *file;
  MemoryMappedFile *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char *in_RSI;
  element_type *in_RDI;
  ptr_t pVar1;
  OnScopeExit tidy;
  FileHandle fd;
  shared_ptr<aeron::util::MemoryMappedFile> *in_stack_fffffffffffffee0;
  allocator *paVar2;
  char *in_stack_fffffffffffffee8;
  string *function;
  anon_class_8_1_3fcf657c_for_f *in_stack_fffffffffffffef8;
  OnScopeExit *in_stack_ffffffffffffff00;
  allocator *this;
  allocator local_c9;
  string local_c8 [40];
  string local_a0 [24];
  size_t in_stack_ffffffffffffff78;
  off_t in_stack_ffffffffffffff80;
  MemoryMappedFile *in_stack_ffffffffffffff88;
  FileHandle in_stack_ffffffffffffff94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_24;
  char *local_10;
  
  local_10 = in_RSI;
  local_24 = open64(in_RSI,2,0x1b6);
  if (local_24 < 0) {
    what = (string *)__cxa_allocate_exception(0x48);
    this = (allocator *)&stack0xffffffffffffff97;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"failed to open existing file: ",this);
    std::operator+(&local_48,&local_68,local_10);
    function = (string *)(local_c8 + 0x27);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a0,
               "static MemoryMappedFile::ptr_t aeron::util::MemoryMappedFile::mapExisting(const char *, off_t, size_t)"
               ,(allocator *)function);
    file = (string *)past_prefix((char *)function,in_stack_fffffffffffffee8);
    paVar2 = &local_c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,(char *)file,paVar2);
    IOException::IOException((IOException *)this,what,function,file,(int)((ulong)paVar2 >> 0x20));
    __cxa_throw(what,&IOException::typeinfo,IOException::~IOException);
  }
  OnScopeExit::
  OnScopeExit<aeron::util::MemoryMappedFile::mapExisting(char_const*,long,unsigned_long)::__0>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  __p = (MemoryMappedFile *)operator_new(0x10);
  MemoryMappedFile(in_stack_ffffffffffffff88,in_stack_ffffffffffffff94,in_stack_ffffffffffffff80,
                   in_stack_ffffffffffffff78);
  std::shared_ptr<aeron::util::MemoryMappedFile>::shared_ptr<aeron::util::MemoryMappedFile,void>
            (in_stack_fffffffffffffee0,__p);
  OnScopeExit::~OnScopeExit((OnScopeExit *)0x1e81ec);
  pVar1.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  pVar1.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (ptr_t)pVar1.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MemoryMappedFile::ptr_t MemoryMappedFile::mapExisting(const char *filename, off_t offset, size_t length)
{
    FileHandle fd;
    fd.handle = ::open(filename, O_RDWR, 0666);

    if (fd.handle < 0)
    {
        throw IOException(std::string("failed to open existing file: ") + filename, SOURCEINFO);
    }

    OnScopeExit tidy([&]()
    {
        close(fd.handle);
    });

    return MemoryMappedFile::ptr_t(new MemoryMappedFile(fd, offset, length));
}